

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::ConsoleReporter::testRunStarting(ConsoleReporter *this,TestRunInfo *_testRunInfo)

{
  ColourImpl *pCVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_type sVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar6;
  char local_1a [2];
  
  uVar2 = *(undefined4 *)((long)&(_testRunInfo->name).m_start + 4);
  sVar4 = (_testRunInfo->name).m_size;
  uVar3 = *(undefined4 *)((long)&(_testRunInfo->name).m_size + 4);
  *(undefined4 *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start =
       *(undefined4 *)&(_testRunInfo->name).m_start;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_start + 4) =
       uVar2;
  *(int *)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size = (int)sVar4;
  *(undefined4 *)((long)&(this->super_StreamingReporterBase).currentTestRunInfo.name.m_size + 4) =
       uVar3;
  iVar5 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar5) != ((long *)CONCAT44(extraout_var,iVar5))[1]) {
    poVar6 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0x16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Filters: ",9);
    iVar5 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    TestSpec::serializeTo((TestSpec *)CONCAT44(extraout_var_00,iVar5),poVar6);
    local_1a[0] = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1a,1);
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0);
  }
  poVar6 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Randomness seeded to: ",0x16);
  getSeed();
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  local_1a[1] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_1a + 1,1);
  return;
}

Assistant:

void ConsoleReporter::testRunStarting(TestRunInfo const& _testRunInfo) {
    StreamingReporterBase::testRunStarting(_testRunInfo);
    if ( m_config->testSpec().hasFilters() ) {
        m_stream << m_colour->guardColour( Colour::BrightYellow ) << "Filters: "
                 << m_config->testSpec() << '\n';
    }
    m_stream << "Randomness seeded to: " << getSeed() << '\n';
}